

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O0

int Gem_ManFree(Gem_Man_t *p)

{
  Gem_Man_t *p_local;
  
  Vec_MemHashFree(p->vTtMem);
  Vec_MemFree(p->vTtMem);
  if (p->pTtElems != (word **)0x0) {
    free(p->pTtElems);
    p->pTtElems = (word **)0x0;
  }
  if (p->pObjs != (Gem_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Gem_Obj_t *)0x0;
  }
  if (p != (Gem_Man_t *)0x0) {
    free(p);
  }
  return 1;
}

Assistant:

int Gem_ManFree( Gem_Man_t * p )
{
    Vec_MemHashFree( p->vTtMem );
    Vec_MemFree( p->vTtMem );
    ABC_FREE( p->pTtElems );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
    return 1;
}